

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O3

void CPU::WDC65816::ProcessorStorageConstructor::stack_pull
               (AccessType param_1,bool is8bit,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  MicroOp local_15;
  MicroOp local_14;
  MicroOp local_13;
  MicroOp local_12;
  MicroOp local_11;
  
  if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*target->_M_invoker)((_Any_data *)target,&local_15);
    if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*target->_M_invoker)((_Any_data *)target,&local_14);
      if (!is8bit) {
        if ((target->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_003e3a0f;
        (*target->_M_invoker)((_Any_data *)target,&local_13);
      }
      if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
        (*target->_M_invoker)((_Any_data *)target,&local_12);
        if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
          (*target->_M_invoker)((_Any_data *)target,&local_11);
          return;
        }
      }
    }
  }
LAB_003e3a0f:
  std::__throw_bad_function_call();
}

Assistant:

static void stack_pull(AccessType, bool is8bit, const std::function<void(MicroOp)> &target) {
		target(CycleFetchPCThrowaway);	// IO.
		target(CycleFetchPCThrowaway);	// IO.

		if(!is8bit) target(CyclePull);	// REG low.
		target(CyclePull);				// REG [high].

		target(OperationPerform);
	}